

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O3

void __thiscall
tsbp::LeftmostActiveOnly::DomainReductionY(LeftmostActiveOnly *this,size_t domainReducedItemIndex)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer __s;
  pointer puVar5;
  bool bVar6;
  reference pvVar7;
  ulong uVar8;
  size_t j;
  pointer pRVar9;
  size_type pos;
  size_t sVar10;
  double dVar11;
  size_t extraout_XMM0_Qb;
  int iVar12;
  allocator<unsigned_long> local_89;
  vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
  *local_88;
  size_t local_80;
  double local_78;
  double dStack_70;
  double local_68;
  size_t sStack_60;
  int iStack_58;
  int iStack_54;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  
  local_88 = (vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
              *)&this->itemSpecificPlacementPointsY;
  local_80 = domainReducedItemIndex;
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::reserve((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_88,
            (long)(this->items).
                  super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->items).
                  super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                  super__Vector_impl_data._M_start >> 5);
  pRVar9 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar9) {
    uVar1 = (this->container).super_Rectangle.Dx;
    uVar3 = (this->container).super_Rectangle.Dy;
    uVar2 = pRVar9[local_80].Dx;
    uVar4 = pRVar9[local_80].Dy;
    local_78 = (double)(int)(uVar1 - uVar2) * 0.5;
    dStack_70 = (double)(int)(uVar3 - uVar4) * 0.5;
    local_68 = floor(local_78);
    sStack_60 = extraout_XMM0_Qb;
    dVar11 = floor(dStack_70);
    iVar12 = (int)local_68;
    iStack_58 = (int)dVar11;
    local_78 = (double)(long)((iStack_58 + 1) * (iVar12 + 1));
    uVar8 = (ulong)iStack_58;
    iStack_54 = -(uint)(iStack_58 < 0);
    local_68 = (double)CONCAT44(-(uint)(iVar12 < 0),iVar12);
    sVar10 = 0;
    do {
      if (sVar10 != (long)pRVar9[sVar10].InternId) {
        __assert_fail("item.InternId == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/tsbp/src/BranchAndBound.cpp"
                      ,0x83,"void tsbp::LeftmostActiveOnly::DomainReductionY(const size_t)");
      }
      if (sVar10 == local_80) {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                  (&local_50,(long)(this->container).super_Rectangle.Dy,0,&local_89);
        pvVar7 = std::
                 vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
                 ::emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                           (local_88,&local_50);
        bVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_50);
        if (!bVar6) {
LAB_0011df29:
          __assert_fail("m_check_invariants()",
                        "/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",0x2be,
                        "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                       );
        }
        if (local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        __s = (pvVar7->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
        puVar5 = (pvVar7->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (__s != puVar5) {
          memset(__s,0,(long)puVar5 - (long)__s & 0xfffffffffffffff8);
        }
        pos = 0;
        do {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(pvVar7,pos,true)
          ;
          pos = pos + 1;
        } while (pos <= uVar8);
        this->reducedItemDomainX = (size_t)local_68;
        this->reducedItemDomainY = sStack_60;
        this->reducedItemFeasiblePlacementPoints = (size_t)local_78;
      }
      else {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                  (&local_50,(long)(this->container).super_Rectangle.Dy,0,&local_89);
        pvVar7 = std::
                 vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
                 ::emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                           (local_88,&local_50);
        bVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_50);
        if (!bVar6) goto LAB_0011df29;
        if (local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(pvVar7);
      }
      sVar10 = sVar10 + 1;
      pRVar9 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (sVar10 < (ulong)((long)(this->items).
                                    super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9 >> 5))
    ;
  }
  return;
}

Assistant:

void LeftmostActiveOnly::DomainReductionY(const size_t domainReducedItemIndex)
{
    itemSpecificPlacementPointsY.reserve(this->items.size());

    int reducedDomainThresholdX = std::floor((this->container.Dx - this->items[domainReducedItemIndex].Dx) / 2.0);
    int reducedDomainThresholdY = std::floor((this->container.Dy - this->items[domainReducedItemIndex].Dy) / 2.0);

    for (size_t i = 0; i < this->items.size(); i++)
    {
        const Rectangle& item = this->items[i];
        assert(item.InternId == i);

        if (i == domainReducedItemIndex)
        {
            auto& bitsetY = this->itemSpecificPlacementPointsY.emplace_back(boost::dynamic_bitset<>(this->container.Dy));
            bitsetY.reset();

            for (size_t j = 0; j <= reducedDomainThresholdY; j++)
            {
                bitsetY.set(j);
            }

            this->reducedItemDomainX = reducedDomainThresholdX;
            this->reducedItemDomainY = reducedDomainThresholdY;
            this->reducedItemFeasiblePlacementPoints = (reducedDomainThresholdX + 1) * (reducedDomainThresholdY + 1);

            continue;
        }

        // TODO: reduce by item.Dy to exclude overlap with the container. Enables simplification of no-overlap checks.
        auto& bitsetY = this->itemSpecificPlacementPointsY.emplace_back(boost::dynamic_bitset<>(this->container.Dy));
        bitsetY.set();
    }
}